

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O2

void get_msurf_descriptor_pecompute_haar(integral_image *iimage,interest_point *ipoint)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int i;
  int iVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  int k_count;
  long lVar25;
  int iVar26;
  ulong uVar27;
  ulong uVar28;
  float *pfVar29;
  float *pfVar30;
  uint uVar31;
  float *pfVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  long lVar36;
  int l_count;
  long lVar37;
  float *pfVar38;
  float *pfVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  float fVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  undefined1 auVar64 [16];
  float fVar65;
  undefined1 in_ZMM8 [64];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar68;
  undefined1 auVar69 [64];
  
  auVar48._8_4_ = 0x3effffff;
  auVar48._0_8_ = 0x3effffff3effffff;
  auVar48._12_4_ = 0x3effffff;
  auVar47._8_4_ = 0x80000000;
  auVar47._0_8_ = 0x8000000080000000;
  auVar47._12_4_ = 0x80000000;
  fVar53 = ipoint->scale;
  auVar69 = ZEXT464((uint)fVar53);
  auVar49 = ZEXT416((uint)fVar53);
  auVar40 = vpternlogd_avx512vl(auVar48,auVar49,auVar47,0xf8);
  auVar40 = ZEXT416((uint)(fVar53 + auVar40._0_4_));
  auVar40 = vroundss_avx(auVar40,auVar40,0xb);
  fVar52 = -0.08 / (fVar53 * fVar53);
  iVar26 = (int)auVar40._0_4_;
  auVar41._0_4_ = (int)auVar40._0_4_;
  auVar41._4_4_ = (int)auVar40._4_4_;
  auVar41._8_4_ = (int)auVar40._8_4_;
  auVar41._12_4_ = (int)auVar40._12_4_;
  auVar40 = vcvtdq2ps_avx(auVar41);
  auVar41 = vpternlogd_avx512vl(auVar48,ZEXT416((uint)ipoint->x),auVar47,0xf8);
  auVar41 = ZEXT416((uint)(ipoint->x + auVar41._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  auVar42._0_8_ = (double)auVar41._0_4_;
  auVar42._8_8_ = auVar41._8_8_;
  auVar46._0_8_ = (double)fVar53;
  auVar46._8_8_ = 0;
  auVar41 = vfmadd231sd_fma(auVar42,auVar46,ZEXT816(0x3fe0000000000000));
  auVar45._0_4_ = (float)auVar41._0_8_;
  auVar45._4_12_ = auVar41._4_12_;
  auVar41 = vpternlogd_avx512vl(auVar48,ZEXT416((uint)ipoint->y),auVar47,0xf8);
  fVar3 = auVar45._0_4_ - auVar40._0_4_;
  auVar41 = ZEXT416((uint)(ipoint->y + auVar41._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  auVar43._0_8_ = (double)auVar41._0_4_;
  auVar43._8_8_ = auVar41._8_8_;
  auVar41 = vfmadd231sd_fma(auVar43,auVar46,ZEXT816(0x3fe0000000000000));
  auVar44._0_4_ = (float)auVar41._0_8_;
  auVar44._4_12_ = auVar41._4_12_;
  fVar68 = auVar44._0_4_ - auVar40._0_4_;
  auVar42 = ZEXT416((uint)fVar53);
  auVar40 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar42,auVar45);
  auVar41 = vpternlogd_avx512vl(auVar48,auVar40,auVar47,0xf8);
  auVar40 = ZEXT416((uint)(auVar40._0_4_ + auVar41._0_4_));
  auVar40 = vroundss_avx(auVar40,auVar40,0xb);
  if (iVar26 < (int)auVar40._0_4_) {
    auVar51._8_4_ = 0x3effffff;
    auVar51._0_8_ = 0x3effffff3effffff;
    auVar51._12_4_ = 0x3effffff;
    auVar50._8_4_ = 0x80000000;
    auVar50._0_8_ = 0x8000000080000000;
    auVar50._12_4_ = 0x80000000;
    auVar40 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar42,auVar44);
    auVar41 = vpternlogd_avx512vl(auVar50,auVar40,auVar51,0xea);
    auVar40 = ZEXT416((uint)(auVar40._0_4_ + auVar41._0_4_));
    auVar40 = vroundss_avx(auVar40,auVar40,0xb);
    if (iVar26 < (int)auVar40._0_4_) {
      auVar40 = vfmadd231ss_fma(auVar45,auVar42,ZEXT416(0x41300000));
      auVar62._8_4_ = 0x80000000;
      auVar62._0_8_ = 0x8000000080000000;
      auVar62._12_4_ = 0x80000000;
      auVar41 = vpternlogd_avx512vl(auVar62,auVar40,auVar51,0xea);
      auVar40 = ZEXT416((uint)(auVar40._0_4_ + auVar41._0_4_));
      auVar40 = vroundss_avx(auVar40,auVar40,0xb);
      if ((int)auVar40._0_4_ + iVar26 <= iimage->width) {
        auVar40 = vfmadd231ss_fma(auVar44,auVar42,ZEXT416(0x41300000));
        auVar57._8_4_ = 0x80000000;
        auVar57._0_8_ = 0x8000000080000000;
        auVar57._12_4_ = 0x80000000;
        auVar41 = vpternlogd_avx512vl(auVar57,auVar40,auVar51,0xea);
        auVar40 = ZEXT416((uint)(auVar40._0_4_ + auVar41._0_4_));
        auVar40 = vroundss_avx(auVar40,auVar40,0xb);
        if ((int)auVar40._0_4_ + iVar26 <= iimage->height) {
          iVar20 = -0xc;
          lVar36 = 0;
          for (lVar37 = 0; lVar37 != 0x18; lVar37 = lVar37 + 1) {
            auVar40._0_4_ = (float)iVar20;
            auVar40._4_12_ = in_ZMM8._4_12_;
            auVar40 = vfmadd213ss_fma(auVar40,auVar69._0_16_,ZEXT416((uint)fVar68));
            lVar25 = 0;
            auVar18._8_4_ = 0x80000000;
            auVar18._0_8_ = 0x8000000080000000;
            auVar18._12_4_ = 0x80000000;
            auVar41 = vpternlogd_avx512vl(auVar51,auVar40,auVar18,0xf8);
            auVar40 = ZEXT416((uint)(auVar40._0_4_ + auVar41._0_4_));
            auVar40 = vroundss_avx(auVar40,auVar40,0xb);
            lVar35 = lVar36;
            for (; lVar25 != 0x18; lVar25 = lVar25 + 1) {
              auVar56._0_4_ = (float)((int)lVar25 + -0xc);
              auVar56._4_12_ = in_ZMM8._4_12_;
              auVar41 = vfmadd132ss_fma(auVar56,ZEXT416((uint)fVar3),ZEXT416((uint)fVar53));
              auVar60._8_4_ = 0x3effffff;
              auVar60._0_8_ = 0x3effffff3effffff;
              auVar60._12_4_ = 0x3effffff;
              auVar19._8_4_ = 0x80000000;
              auVar19._0_8_ = 0x8000000080000000;
              auVar19._12_4_ = 0x80000000;
              auVar42 = vpternlogd_avx512vl(auVar60,auVar41,auVar19,0xf8);
              auVar41 = ZEXT416((uint)(auVar41._0_4_ + auVar42._0_4_));
              auVar41 = vroundss_avx(auVar41,auVar41,0xb);
              haarXY_unconditional
                        (iimage,(int)auVar40._0_4_,(int)auVar41._0_4_,iVar26,
                         (float *)((long)haarResponseX + lVar35),
                         (float *)((long)haarResponseY + lVar35));
              lVar35 = lVar35 + 4;
            }
            auVar69 = ZEXT1664(auVar49);
            auVar51._8_4_ = 0x3effffff;
            auVar51._0_8_ = 0x3effffff3effffff;
            auVar51._12_4_ = 0x3effffff;
            iVar20 = iVar20 + 1;
            lVar36 = lVar36 + 0x60;
          }
          goto LAB_0014bd93;
        }
      }
    }
  }
  iVar20 = -0xc;
  lVar36 = 0;
  for (lVar37 = 0; lVar37 != 0x18; lVar37 = lVar37 + 1) {
    auVar54._0_4_ = (float)iVar20;
    auVar54._4_12_ = in_ZMM8._4_12_;
    auVar40 = vfmadd213ss_fma(auVar54,auVar69._0_16_,ZEXT416((uint)fVar68));
    auVar58._8_4_ = 0x3effffff;
    auVar58._0_8_ = 0x3effffff3effffff;
    auVar58._12_4_ = 0x3effffff;
    lVar25 = 0;
    auVar15._8_4_ = 0x80000000;
    auVar15._0_8_ = 0x8000000080000000;
    auVar15._12_4_ = 0x80000000;
    auVar41 = vpternlogd_avx512vl(auVar58,auVar40,auVar15,0xf8);
    auVar40 = ZEXT416((uint)(auVar40._0_4_ + auVar41._0_4_));
    auVar40 = vroundss_avx(auVar40,auVar40,0xb);
    lVar35 = lVar36;
    for (; lVar25 != 0x18; lVar25 = lVar25 + 1) {
      auVar55._0_4_ = (float)((int)lVar25 + -0xc);
      auVar55._4_12_ = in_ZMM8._4_12_;
      auVar41 = vfmadd132ss_fma(auVar55,ZEXT416((uint)fVar3),ZEXT416((uint)fVar53));
      auVar59._8_4_ = 0x3effffff;
      auVar59._0_8_ = 0x3effffff3effffff;
      auVar59._12_4_ = 0x3effffff;
      auVar16._8_4_ = 0x80000000;
      auVar16._0_8_ = 0x8000000080000000;
      auVar16._12_4_ = 0x80000000;
      auVar42 = vpternlogd_avx512vl(auVar59,auVar41,auVar16,0xf8);
      auVar41 = ZEXT416((uint)(auVar41._0_4_ + auVar42._0_4_));
      auVar41 = vroundss_avx(auVar41,auVar41,0xb);
      haarXY_precheck_boundaries
                (iimage,(int)auVar40._0_4_,(int)auVar41._0_4_,iVar26,
                 (float *)((long)haarResponseX + lVar35),(float *)((long)haarResponseY + lVar35));
      lVar35 = lVar35 + 4;
    }
    auVar69 = ZEXT1664(auVar49);
    iVar20 = iVar20 + 1;
    lVar36 = lVar36 + 0x60;
  }
LAB_0014bd93:
  fVar68 = auVar69._0_4_;
  auVar67._8_4_ = 0x3effffff;
  auVar67._0_8_ = 0x3effffff3effffff;
  auVar67._12_4_ = 0x3effffff;
  auVar66._8_4_ = 0x80000000;
  auVar66._0_8_ = 0x8000000080000000;
  auVar66._12_4_ = 0x80000000;
  auVar40 = vpternlogd_avx512vl(auVar67,ZEXT416((uint)(fVar68 * 0.5)),auVar66,0xf8);
  auVar40 = ZEXT416((uint)(fVar68 * 0.5 + auVar40._0_4_));
  auVar40 = vroundss_avx(auVar40,auVar40,0xb);
  auVar41 = vpternlogd_avx512vl(auVar67,ZEXT416((uint)(fVar68 * 1.5)),auVar66,0xf8);
  auVar41 = ZEXT416((uint)(fVar68 * 1.5 + auVar41._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  auVar42 = vpternlogd_avx512vl(auVar67,ZEXT416((uint)(fVar68 * 2.5)),auVar66,0xf8);
  auVar42 = ZEXT416((uint)(fVar68 * 2.5 + auVar42._0_4_));
  auVar42 = vroundss_avx(auVar42,auVar42,0xb);
  auVar43 = vpternlogd_avx512vl(auVar67,ZEXT416((uint)(fVar68 * 3.5)),auVar66,0xf8);
  auVar43 = ZEXT416((uint)(fVar68 * 3.5 + auVar43._0_4_));
  auVar43 = vroundss_avx(auVar43,auVar43,0xb);
  auVar44 = vpternlogd_avx512vl(auVar67,ZEXT416((uint)(fVar68 * 4.5)),auVar66,0xf8);
  auVar44 = ZEXT416((uint)(fVar68 * 4.5 + auVar44._0_4_));
  auVar44 = vroundss_avx(auVar44,auVar44,0xb);
  auVar45 = vpternlogd_avx512vl(auVar67,ZEXT416((uint)(fVar68 * 5.5)),auVar66,0xf8);
  auVar45 = ZEXT416((uint)(fVar68 * 5.5 + auVar45._0_4_));
  auVar45 = vroundss_avx(auVar45,auVar45,0xb);
  auVar46 = vpternlogd_avx512vl(auVar67,ZEXT416((uint)(fVar68 * 6.5)),auVar66,0xf8);
  auVar46 = ZEXT416((uint)(fVar68 * 6.5 + auVar46._0_4_));
  auVar46 = vroundss_avx(auVar46,auVar46,0xb);
  auVar47 = vpternlogd_avx512vl(auVar67,ZEXT416((uint)(fVar68 * 7.5)),auVar66,0xf8);
  auVar47 = ZEXT416((uint)(auVar47._0_4_ + fVar68 * 7.5));
  auVar47 = vroundss_avx(auVar47,auVar47,0xb);
  auVar48 = vpternlogd_avx512vl(auVar67,ZEXT416((uint)(fVar68 * 8.5)),auVar66,0xf8);
  auVar48 = ZEXT416((uint)(fVar68 * 8.5 + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49 = vpternlogd_avx512vl(auVar67,ZEXT416((uint)(fVar68 * 9.5)),auVar66,0xf8);
  auVar49 = ZEXT416((uint)(fVar68 * 9.5 + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar50 = vpternlogd_avx512vl(auVar67,ZEXT416((uint)(fVar68 * 10.5)),auVar66,0xf8);
  auVar50 = ZEXT416((uint)(fVar68 * 10.5 + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar51 = vpternlogd_avx512vl(auVar67,ZEXT416((uint)(fVar68 * 11.5)),auVar66,0xf8);
  fVar61 = auVar42._0_4_;
  fVar53 = fVar61 + auVar41._0_4_;
  fVar3 = fVar61 + auVar40._0_4_;
  auVar42 = ZEXT416((uint)(fVar68 * 11.5 + auVar51._0_4_));
  auVar42 = vroundss_avx(auVar42,auVar42,0xb);
  fVar68 = fVar61 - auVar40._0_4_;
  fVar4 = fVar61 - auVar41._0_4_;
  fVar5 = fVar61 - auVar43._0_4_;
  fVar6 = fVar61 - auVar44._0_4_;
  fVar7 = fVar61 - auVar45._0_4_;
  fVar61 = fVar61 - auVar46._0_4_;
  fVar65 = auVar47._0_4_;
  fVar8 = fVar65 - auVar43._0_4_;
  fVar9 = fVar65 - auVar44._0_4_;
  fVar10 = fVar65 - auVar45._0_4_;
  fVar11 = fVar65 - auVar46._0_4_;
  fVar12 = fVar65 - auVar48._0_4_;
  fVar13 = fVar65 - auVar49._0_4_;
  fVar14 = fVar65 - auVar50._0_4_;
  fVar65 = fVar65 - auVar42._0_4_;
  gauss_s1_c0[0] = expf(fVar53 * fVar53 * fVar52);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar52);
  gauss_s1_c0[2] = expf(fVar68 * fVar68 * fVar52);
  gauss_s1_c0[3] = expf(fVar4 * fVar4 * fVar52);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar5 * fVar5 * fVar52);
  gauss_s1_c0[6] = expf(fVar6 * fVar6 * fVar52);
  gauss_s1_c0[7] = expf(fVar7 * fVar7 * fVar52);
  gauss_s1_c0[8] = expf(fVar61 * fVar61 * fVar52);
  gauss_s1_c1[0] = expf(fVar8 * fVar8 * fVar52);
  gauss_s1_c1[1] = expf(fVar9 * fVar9 * fVar52);
  gauss_s1_c1[2] = expf(fVar10 * fVar10 * fVar52);
  gauss_s1_c1[3] = expf(fVar11 * fVar11 * fVar52);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar12 * fVar12 * fVar52);
  gauss_s1_c1[6] = expf(fVar13 * fVar13 * fVar52);
  gauss_s1_c1[7] = expf(fVar14 * fVar14 * fVar52);
  gauss_s1_c1[8] = expf(fVar65 * fVar65 * fVar52);
  auVar69 = ZEXT1264(ZEXT812(0));
  iVar26 = 0;
  auVar49._8_4_ = 0x7fffffff;
  auVar49._0_8_ = 0x7fffffff7fffffff;
  auVar49._12_4_ = 0x7fffffff;
  lVar36 = 0;
  uVar33 = 0xfffffffffffffff8;
  pfVar22 = haarResponseY;
  pfVar29 = haarResponseX;
  while (uVar31 = (uint)uVar33, (int)uVar31 < 8) {
    pfVar38 = gauss_s1_c0;
    lVar37 = (long)iVar26;
    lVar36 = (long)(int)lVar36;
    if (uVar31 == 7) {
      pfVar38 = gauss_s1_c1;
    }
    if (uVar31 == 0xfffffff8) {
      pfVar38 = gauss_s1_c1;
    }
    uVar27 = 0;
    iVar26 = iVar26 + 4;
    uVar34 = 0xfffffffffffffff8;
    pfVar23 = pfVar22;
    pfVar30 = pfVar29;
    while (lVar37 != iVar26) {
      iVar20 = (int)uVar34;
      pfVar32 = gauss_s1_c0;
      auVar63 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar34 = (ulong)((uint)(uVar34 >> 0x1c) & 8);
      if (iVar20 == 7) {
        pfVar32 = gauss_s1_c1;
      }
      if (iVar20 == -8) {
        pfVar32 = gauss_s1_c1;
      }
      pfVar21 = pfVar30;
      pfVar24 = pfVar23;
      for (uVar28 = uVar27; uVar28 < iVar20 * 0x18 + 0x198; uVar28 = uVar28 + 0x18) {
        lVar35 = 0;
        pfVar39 = (float *)((long)pfVar38 + (ulong)(((uint)(uVar33 >> 0x1f) & 1) << 5));
        while (lVar35 != 9) {
          fVar53 = *pfVar39;
          pfVar39 = pfVar39 + (ulong)(~uVar31 >> 0x1f) * 2 + -1;
          pfVar1 = pfVar24 + lVar35;
          pfVar2 = pfVar21 + lVar35;
          lVar35 = lVar35 + 1;
          auVar42 = ZEXT416((uint)(pfVar32[uVar34] * fVar53 * *pfVar2));
          auVar40 = vandps_avx(auVar42,auVar49);
          auVar43 = ZEXT416((uint)(pfVar32[uVar34] * fVar53 * *pfVar1));
          auVar41 = vandps_avx(auVar43,auVar49);
          auVar42 = vinsertps_avx(auVar43,auVar42,0x10);
          auVar41 = vmovlhps_avx(auVar42,auVar41);
          auVar40 = vinsertps_avx(auVar41,auVar40,0x30);
          auVar63 = ZEXT1664(CONCAT412(auVar63._12_4_ + auVar40._12_4_,
                                       CONCAT48(auVar63._8_4_ + auVar40._8_4_,
                                                CONCAT44(auVar63._4_4_ + auVar40._4_4_,
                                                         auVar63._0_4_ + auVar40._0_4_))));
        }
        uVar34 = uVar34 + (ulong)(-1 < iVar20) * 2 + -1;
        pfVar21 = pfVar21 + 0x18;
        pfVar24 = pfVar24 + 0x18;
      }
      uVar34 = (ulong)(iVar20 + 5);
      uVar27 = uVar27 + 0x78;
      fVar53 = gauss_s2_arr[lVar37];
      auVar17._4_4_ = fVar53;
      auVar17._0_4_ = fVar53;
      auVar17._8_4_ = fVar53;
      auVar17._12_4_ = fVar53;
      auVar43 = vmulps_avx512vl(auVar63._0_16_,auVar17);
      lVar37 = lVar37 + 1;
      auVar64._0_4_ = auVar43._0_4_ * auVar43._0_4_;
      auVar64._4_4_ = auVar43._4_4_ * auVar43._4_4_;
      auVar64._8_4_ = auVar43._8_4_ * auVar43._8_4_;
      auVar64._12_4_ = auVar43._12_4_ * auVar43._12_4_;
      auVar41 = vshufpd_avx(auVar43,auVar43,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar36) = auVar43;
      lVar36 = lVar36 + 4;
      pfVar30 = pfVar30 + 0x78;
      pfVar23 = pfVar23 + 0x78;
      auVar40 = vmovshdup_avx(auVar64);
      auVar42 = vfmadd231ss_fma(auVar40,auVar43,auVar43);
      auVar40 = vshufps_avx(auVar43,auVar43,0xff);
      auVar41 = vfmadd213ss_fma(auVar41,auVar41,auVar42);
      auVar40 = vfmadd213ss_fma(auVar40,auVar40,auVar41);
      auVar69 = ZEXT464((uint)(auVar69._0_4_ + auVar40._0_4_));
    }
    pfVar29 = pfVar29 + 5;
    pfVar22 = pfVar22 + 5;
    uVar33 = (ulong)(uVar31 + 5);
  }
  if (auVar69._0_4_ < 0.0) {
    fVar53 = sqrtf(auVar69._0_4_);
  }
  else {
    auVar40 = vsqrtss_avx(auVar69._0_16_,auVar69._0_16_);
    fVar53 = auVar40._0_4_;
  }
  for (lVar36 = 0; lVar36 != 0x40; lVar36 = lVar36 + 1) {
    ipoint->descriptor[lVar36] = (1.0 / fVar53) * ipoint->descriptor[lVar36];
  }
  return;
}

Assistant:

void get_msurf_descriptor_pecompute_haar(struct integral_image* iimage, struct interest_point* ipoint) {
    /*
    applied optimizations:
        - all of get_msurf_descriptor_gauss_compute_once_array
        - precompute haar wavelet responses and store them in two 24x24 arrays
    */

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale = (int) roundf(scale);
    // int int_scale_mul_2 =  2 * int_scale;
    float scale_squared = scale*scale;

    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    //float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    //r(2.5*s) + r(1.5*s) == -(r(2.5*s) - r(6.5*s))

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    { // some outside

        for (int l=-12, l_count=0; l<12; ++l, ++l_count) {
            // int sample_y = (int) roundf(ipoint_y + l * scale);
            int sample_y_sub_int_scale = (int) roundf(ipoint_y_sub_int_scale + l * scale);

            for (int k=-12, k_count=0; k<12; ++k, k_count++) {

                //Get x coords of sample point
                // int sample_x = (int) roundf(ipoint_x + k * scale);
                int sample_x_sub_int_scale = (int) roundf(ipoint_x_sub_int_scale + k * scale);;

                // float rx = 0.0f;
                // float ry = 0.0f;
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &haarResponseX[l_count*24+k_count], &haarResponseY[l_count*24+k_count]);

                // haarResponseX[(l+12)*24+(k+12)] = rx;
                // haarResponseY[(l+12)*24+(k+12)] = ry;
            }

        }

    } else {

        for (int l=-12, l_count=0; l<12; ++l, ++l_count) {
            // int sample_y = (int) roundf(ipoint_y + l * scale);
            int sample_y_sub_int_scale = (int) roundf(ipoint_y_sub_int_scale + l * scale);

            for (int k=-12, k_count=0; k<12; ++k, ++k_count) {

                //Get x coords of sample point
                // int sample_x = (int) roundf(ipoint_x + k * scale);
                int sample_x_sub_int_scale = (int) roundf(ipoint_x_sub_int_scale + k * scale);;

                // float rx = 0.0f;
                // float ry = 0.0f;
                haarXY_unconditional(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &haarResponseX[l_count*24+k_count], &haarResponseY[l_count*24+k_count]);

                // haarResponseX[(l+12)*24+(k+12)] = rx;
                // haarResponseY[(l+12)*24+(k+12)] = ry;
            }

        }
        
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    /*
    for (int i=-8; i<8; i+=5) {

        for (int j=-8; j<8; j+=5) {

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            //int xs = (int) roundf(ipoint_x + (i+0.5f) * scale);
            //int ys = (int) roundf(ipoint_y + (j+0.5f) * scale);

            int gauss_index_l = -4;
            for (int l = j-4; l < j + 5; ++l, ++gauss_index_l) {

                //Get y coords of sample point
                // int sample_y = (int) roundf(ipoint_y + l * scale);
                //float ys_sub_sample_y = (float) ys-sample_y;
                //float ys_sub_sample_y_squared = ys_sub_sample_y*ys_sub_sample_y;

                //Get y coords of sample point
                // int sample_y_sub_int_scale = sample_y-int_scale;

                float gauss_s1_y = -1;
                if (j == -8 ) {
                    gauss_s1_y = gauss_s1_c1[8-(gauss_index_l+4)];
                } else if (j == -3) {
                    gauss_s1_y = gauss_s1_c0[8-(gauss_index_l+4)];
                } else if (j == 2) {
                    gauss_s1_y = gauss_s1_c0[gauss_index_l+4];
                } else if (j == 7) {
                    gauss_s1_y = gauss_s1_c1[gauss_index_l+4];
                }

                int gauss_index_k = -4;
                for (int k = i-4; k < i + 5; ++k, ++gauss_index_k) {
                
                    //Get x coords of sample point
                    // int sample_x = (int) roundf(ipoint_x + k * scale);

                    //Get x coords of sample point
                    // int sample_x_sub_int_scale = sample_x-int_scale;

                    float gauss_s1_x = -1;
                    if (i == -8 ) {
                        gauss_s1_x = gauss_s1_c1[8-(gauss_index_k+4)];
                    } else if (i == -3) {
                        gauss_s1_x = gauss_s1_c0[8-(gauss_index_k+4)];
                    } else if (i == 2) {
                        gauss_s1_x = gauss_s1_c0[gauss_index_k+4];
                    } else if (i == 7) {
                        gauss_s1_x = gauss_s1_c1[gauss_index_k+4];
                    }

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[(l+12)*24+(k+12)];
                    float ry = haarResponseY[(l+12)*24+(k+12)];
                    // haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &rx, &ry);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }
    */
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}